

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall QList<QLocale>::reserve(QList<QLocale> *this,qsizetype asize)

{
  ArrayOptions *pAVar1;
  QLocale *pQVar2;
  uint uVar3;
  Data *pDVar4;
  QLocale *pQVar5;
  long lVar6;
  QLocale *this_00;
  QLocale *other;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<QLocale> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->d).d;
  if ((pDVar4 != (Data *)0x0) &&
     (asize <= (pDVar4->super_QArrayData).alloc -
               ((long)((long)(this->d).ptr -
                      ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 3))) {
    uVar3 = (pDVar4->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
            super_QFlagsStorage<QArrayData::ArrayOption>.i;
    if ((uVar3 & 1) != 0) goto LAB_00316d1e;
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 1) {
      (pDVar4->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
      super_QFlagsStorage<QArrayData::ArrayOption>.i = uVar3 | 1;
      goto LAB_00316d1e;
    }
  }
  lVar6 = (this->d).size;
  if (asize < lVar6) {
    asize = lVar6;
  }
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar5 = (QLocale *)QArrayData::allocate((QArrayData **)&local_58,8,0x10,asize,KeepSize);
  pDVar4 = local_58.d;
  lVar6 = (this->d).size;
  if (lVar6 < 1) {
    lVar6 = 0;
  }
  else {
    other = (this->d).ptr;
    pQVar2 = other + lVar6;
    lVar6 = 0;
    this_00 = pQVar5;
    do {
      QLocale::QLocale(this_00,other);
      other = other + 1;
      lVar6 = lVar6 + 1;
      this_00 = this_00 + 1;
    } while (other < pQVar2);
  }
  if (pDVar4 != (Data *)0x0) {
    pAVar1 = &(pDVar4->super_QArrayData).flags;
    *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  local_58.d = (this->d).d;
  local_58.ptr = (this->d).ptr;
  (this->d).d = pDVar4;
  (this->d).ptr = pQVar5;
  local_58.size = (this->d).size;
  (this->d).size = lVar6;
  QArrayDataPointer<QLocale>::~QArrayDataPointer(&local_58);
LAB_00316d1e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}